

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void feel_location(xchar x,xchar y)

{
  monst *mon_00;
  xchar y_00;
  xchar x_00;
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  uint uVar4;
  bool bVar5;
  bool local_49;
  bool local_44;
  monst *local_38;
  uint local_30 [2];
  uint bcprize;
  uint bcstack;
  monst *mon;
  obj *boulder;
  rm *loc;
  xchar y_local;
  xchar x_local;
  
  boulder = (obj *)(level->locations[x] + y);
  if (((((*(uint *)&level->locations[x][y].field_0x6 >> 3 & 1) != 0) &&
       (level->monsters[x][y] != (monst *)0x0)) &&
      ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) == 0)) &&
     (level->monsters[x][y] != (monst *)0x0)) {
    return;
  }
  loc._6_1_ = y;
  loc._7_1_ = x;
  if (((((byte)u._1052_1_ >> 1 & 1) != 0) &&
      (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) &&
     (bVar1 = is_pool(level,(int)loc._7_1_,(int)loc._6_1_), bVar1 == '\0')) {
    return;
  }
  set_seenv((rm *)boulder,(int)u.ux,(int)u.uy,(int)loc._7_1_,(int)loc._6_1_);
  if ((((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
      ((youmonst.data)->mlet != '\x05')) ||
     ((bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar1 != '\0' ||
      (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 != '\0')))) {
    map_location((int)loc._7_1_,(int)loc._6_1_,1);
    if (uball != (obj *)0x0) {
      if ((uchain->ox == loc._7_1_) && (uchain->oy == loc._6_1_)) {
        u.bc_felt = u.bc_felt | 2;
        local_30[0] = 0;
        local_30[1] = 0;
        topobj_at((int)loc._7_1_,(int)loc._6_1_,'\x01',&u.cglyph,&u.cobjmn,local_30 + 1,local_30);
        u._996_1_ = u._996_1_ & 0xf5 | ((byte)local_30[1] & 1) << 1 | ((byte)local_30[0] & 1) << 3;
      }
      if (((uball->where != '\x03') && (uball->ox == loc._7_1_)) && (uball->oy == loc._6_1_)) {
        u.bc_felt = u.bc_felt | 1;
        local_30[0] = 0;
        local_30[1] = 0;
        topobj_at((int)loc._7_1_,(int)loc._6_1_,'\x01',&u.bglyph,&u.bobjmn,local_30 + 1,local_30);
        u._996_1_ = u._996_1_ & 0xfa | (byte)local_30[1] & 1 | ((byte)local_30[0] & 1) << 2;
      }
    }
    if (((*(char *)((long)&boulder->nobj + 4) == '\x19') && (((ulong)boulder->nobj & 0x3f) == 0xf))
       && ((*(uint *)((long)&boulder->nobj + 6) >> 0xb & 1) == 0)) {
      *(uint *)&boulder->nobj = *(uint *)&boulder->nobj & 0xffffffc0 | 0x10;
      *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffe;
      *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffd;
      dbuf_set_loc((int)loc._7_1_,(int)loc._6_1_);
    }
    else if (((*(char *)((long)&boulder->nobj + 4) == '\x18') &&
             (((ulong)boulder->nobj & 0x3f) == 0xe)) &&
            ((*(uint *)((long)&boulder->nobj + 6) >> 0xb & 1) == 0)) {
      *(uint *)&boulder->nobj = *(uint *)&boulder->nobj & 0xffffffc0 | 0xd;
      *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffe;
      *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffd;
      dbuf_set_loc((int)loc._7_1_,(int)loc._6_1_);
    }
  }
  else if ((*(char *)((long)&boulder->nobj + 4) < '\x11') ||
          ((*(char *)((long)&boulder->nobj + 4) == '\x17' &&
           ((*(uint *)((long)&boulder->nobj + 6) >> 4 & 0xc) != 0)))) {
    map_background(loc._7_1_,loc._6_1_,1);
  }
  else {
    mon = (monst *)sobj_at(0x214,level,(int)loc._7_1_,(int)loc._6_1_);
    if (mon == (monst *)0x0) {
      if (*(char *)((long)&boulder->nobj + 4) == '\x17') {
        map_background(loc._7_1_,loc._6_1_,1);
      }
      else if ((*(char *)((long)&boulder->nobj + 4) < '\x19') &&
              ((*(char *)((long)&boulder->nobj + 4) < '\x11' ||
               ('\x14' < *(char *)((long)&boulder->nobj + 4))))) {
        map_background(loc._7_1_,loc._6_1_,1);
        if (((*(char *)((long)&boulder->nobj + 4) == '\x18') &&
            (((ulong)boulder->nobj & 0x3f) == 0xe)) &&
           ((*(uint *)((long)&boulder->nobj + 6) >> 0xb & 1) == 0)) {
          *(uint *)&boulder->nobj = *(uint *)&boulder->nobj & 0xffffffc0 | 0xd;
          *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffe;
          *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffd;
          dbuf_set_loc((int)loc._7_1_,(int)loc._6_1_);
        }
      }
      else if ((*(uint *)&boulder->nobj >> 0xb & 0x3ff) == 0x215) {
        if ((*(char *)((long)&boulder->nobj + 4) == '\x19') ||
           (*(char *)((long)&boulder->nobj + 5) == '\0')) {
          uVar4 = 0x10;
          if ((*(uint *)((long)&boulder->nobj + 6) >> 0xb & 1) != 0) {
            uVar4 = 0xf;
          }
          *(uint *)&boulder->nobj = *(uint *)&boulder->nobj & 0xffffffc0 | uVar4;
          *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffe;
          *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffd;
          dbuf_set_loc((int)loc._7_1_,(int)loc._6_1_);
        }
        else {
          map_background(loc._7_1_,loc._6_1_,1);
        }
      }
      else if (((*(uint *)&boulder->nobj & 0x3f) < 0xf) ||
              ((*(uint *)((long)&boulder->nobj + 6) >> 3 & 1) != 0)) {
        uVar4 = 0x10;
        if ((*(uint *)((long)&boulder->nobj + 6) >> 0xb & 1) != 0) {
          uVar4 = 0xf;
        }
        *(uint *)&boulder->nobj = *(uint *)&boulder->nobj & 0xffffffc0 | uVar4;
        *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffe;
        *(uint *)((long)&boulder->nobj + 6) = *(uint *)((long)&boulder->nobj + 6) & 0xfffffffd;
        dbuf_set_loc((int)loc._7_1_,(int)loc._6_1_);
      }
    }
    else {
      map_object((obj *)mon,1);
    }
  }
  if ((loc._7_1_ == u.ux) && (loc._6_1_ == u.uy)) {
    return;
  }
  if ((level->monsters[loc._7_1_][loc._6_1_] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[loc._7_1_][loc._6_1_]->field_0x60 >> 9 & 1) != 0)) {
    local_38 = (monst *)0x0;
  }
  else {
    local_38 = level->monsters[loc._7_1_][loc._6_1_];
  }
  _bcprize = local_38;
  if (local_38 == (monst *)0x0) {
    return;
  }
  if (((((local_38->data->mflags1 & 0x10000) != 0) ||
       ((poVar3 = which_armor(local_38,4), poVar3 != (obj *)0x0 &&
        (poVar3 = which_armor(_bcprize,4), poVar3->otyp == 0x4f)))) ||
      (((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((u.uprops[0x19].intrinsic == 0 &&
             ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
            (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
        (u.uprops[0x19].blocked != 0)) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar2 = dist2((int)_bcprize->mx,(int)_bcprize->my,(int)u.ux,(int)u.uy), 0x40 < iVar2))))))
     && (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
         (bVar1 = match_warn_of_mon(_bcprize), bVar1 == '\0')))) {
    return;
  }
  x_00 = loc._7_1_;
  y_00 = loc._6_1_;
  mon_00 = _bcprize;
  if (((_bcprize->data->mflags1 & 0x10000) == 0) &&
     ((poVar3 = which_armor(_bcprize,4), poVar3 == (obj *)0x0 ||
      (poVar3 = which_armor(_bcprize,4), poVar3->otyp != 0x4f)))) {
    if (((((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
        ((((u.uprops[0x19].intrinsic != 0 ||
           ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
          (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))) &&
       (bVar5 = true, u.uprops[0x19].blocked == 0)) goto LAB_0018a6c9;
    if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
      iVar2 = dist2((int)_bcprize->mx,(int)_bcprize->my,(int)u.ux,(int)u.uy);
      bVar5 = true;
      if (iVar2 < 0x41) goto LAB_0018a6c9;
    }
  }
  bVar1 = match_warn_of_mon(_bcprize);
  bVar5 = bVar1 != '\0';
LAB_0018a6c9:
  iVar2 = 2;
  if (bVar5) {
    iVar2 = 1;
  }
  local_44 = false;
  if (_bcprize != (monst *)0x0) {
    local_49 = true;
    if (loc._7_1_ == _bcprize->mx) {
      local_49 = loc._6_1_ != _bcprize->my;
    }
    local_44 = local_49;
  }
  display_monster(x_00,y_00,mon_00,iVar2,local_44);
  return;
}

Assistant:

void feel_location(xchar x, xchar y)
{
    struct rm *loc = &(level->locations[x][y]);
    struct obj *boulder;
    struct monst *mon;

    /* If the hero's memory of an invisible monster is accurate, we want to keep
     * him from detecting the same monster over and over again on each turn.
     * We must return (so we don't erase the monster).  (We must also, in the
     * search function, be sure to skip over previously detected 'I's.)
     */
    if (level->locations[x][y].mem_invis && m_at(level, x,y)) return;

    /* The hero can't feel non pool locations while under water. */
    if (Underwater && !Is_waterlevel(&u.uz) && ! is_pool(level, x,y))
	return;

    /* Set the seen vector as if the hero had seen it.  It doesn't matter */
    /* if the hero is levitating or not.				  */
    set_seenv(loc, u.ux, u.uy, x, y);

    if (Levitation && !Is_airlevel(&u.uz) && !Is_waterlevel(&u.uz)) {
	/*
	 * Levitation Rules.  It is assumed that the hero can feel the state
	 * of the walls around herself and can tell if she is in a corridor,
	 * room, or doorway.  Boulders are felt because they are large enough.
	 * Anything else is unknown because the hero can't reach the ground.
	 * This makes things difficult.
	 *
	 * Check (and display) in order:
	 *
	 *	+ Stone, walls, and closed doors.
	 *	+ Boulders.  [see a boulder before a doorway]
	 *	+ Doors.
	 *	+ Room/water positions
	 *	+ Everything else (hallways!)
	 */
	if (IS_ROCK(loc->typ) || (IS_DOOR(loc->typ) &&
				(loc->doormask & (D_LOCKED | D_CLOSED)))) {
	    map_background(x, y, 1);
	} else if ((boulder = sobj_at(BOULDER, level, x,y)) != 0) {
	    map_object(boulder, 1);
	} else if (IS_DOOR(loc->typ)) {
	    map_background(x, y, 1);
	} else if (IS_ROOM(loc->typ) || IS_POOL(loc->typ)) {
	    /*
	     * An open room or water location.  Normally we wouldn't touch
	     * this, but we have to get rid of remembered boulder symbols.
	     * This will only occur in rare occations when the hero goes
	     * blind and doesn't find a boulder where expected (something
	     * came along and picked it up).  We know that there is not a
	     * boulder at this location.  Show fountains, pools, etc.
	     * underneath if already seen.  Otherwise, show the appropriate
	     * floor symbol.
	     *
	     * Similarly, if the hero digs a hole in a wall or feels a location
	     * that used to contain an unseen monster.  In these cases,
	     * there's no reason to assume anything was underneath, so
	     * just show the appropriate floor symbol.  If something was
	     * embedded in the wall, the glyph will probably already
	     * reflect that.  Don't change the symbol in this case.
	     *
	     * This isn't quite correct.  If the boulder was on top of some
	     * other objects they should be seen once the boulder is removed.
	     * However, we have no way of knowing that what is there now
	     * was there then.  So we let the hero have a lapse of memory.
	     * We could also just display what is currently on the top of the
	     * object stack (if anything).
	     */
	    if (loc->mem_obj - 1 == BOULDER) {
		if (loc->typ != ROOM && loc->seenv) {
		    map_background(x, y, 1);
		} else {
		    loc->mem_bg = loc->waslit ? S_room : S_darkroom;
		    loc->mem_door_l = 0;
		    loc->mem_door_t = 0;
		    dbuf_set_loc(x, y);
		}
	    } else if (loc->mem_bg < S_room || loc->mem_invis) {
		loc->mem_bg = loc->waslit ? S_room : S_darkroom;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    }
	} else {
	    /* We feel it (I think hallways are the only things left). */
	    map_background(x, y, 1);
	    /* Corridors are never felt as lit (unless remembered that way) */
	    /* (lit_corridor only).					    */
	    if (loc->typ == CORR && loc->mem_bg == S_litcorr && !loc->waslit) {
		loc->mem_bg = S_corr;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    }
	}
    } else {
	map_location(x, y, 1);

	if (Punished) {
	    /*
	     * Update object-under-ball/chain info for layered display system.
	     * If we don't, then when the ball/chain is moved it will drop
	     * the wrong glyph.
	     */
	    unsigned bcstack, bcprize;
	    if (uchain->ox == x && uchain->oy == y) {
		u.bc_felt |= BC_CHAIN;
		bcstack = bcprize = 0;
		topobj_at(x, y, TRUE, &u.cglyph, &u.cobjmn, &bcstack, &bcprize);
		u.cstack = bcstack;
		u.coprize = bcprize;
	    }
	    if (!carried(uball) && uball->ox == x && uball->oy == y) {
		u.bc_felt |= BC_BALL;
		bcstack = bcprize = 0;
		topobj_at(x, y, TRUE, &u.bglyph, &u.bobjmn, &bcstack, &bcprize);
		u.bstack = bcstack;
		u.boprize = bcprize;
	    }
	}

	/* Floor spaces are dark if unlit.  Corridors are dark if unlit. */
	if (loc->typ == ROOM && loc->mem_bg == S_room && !loc->waslit) {
	    loc->mem_bg = S_darkroom;
	    loc->mem_door_l = 0;
	    loc->mem_door_t = 0;
	    dbuf_set_loc(x, y);
	} else if (loc->typ == CORR &&
		    loc->mem_bg == S_litcorr && !loc->waslit) {
	    loc->mem_bg = S_corr;
	    loc->mem_door_l = 0;
	    loc->mem_door_t = 0;
	    dbuf_set_loc(x, y);
	}
    }
    /* draw monster on top if we can sense it */
    if ((x != u.ux || y != u.uy) && (mon = m_at(level, x,y)) && sensemon(mon))
	display_monster(x, y, mon,
		(tp_sensemon(mon) || match_warn_of_mon(mon)) ? PHYSICALLY_SEEN : DETECTED,
		is_worm_tail(mon));
}